

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O1

MempoolAcceptResult *
MempoolAcceptResult::FeeFailure
          (MempoolAcceptResult *__return_storage_ptr__,TxValidationState state,
          CFeeRate effective_feerate,
          vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          *wtxids_fee_calculations)

{
  long lVar1;
  TxValidationState state_00;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 uVar2;
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffff90;
  long in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined1 *puVar4;
  undefined8 in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(undefined8 *)effective_feerate.nSatoshisPerK;
  puVar3 = &stack0xffffffffffffff98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff88,*(long *)(effective_feerate.nSatoshisPerK + 8),
             *(long *)(effective_feerate.nSatoshisPerK + 0x10) +
             *(long *)(effective_feerate.nSatoshisPerK + 8));
  puVar4 = &stack0xffffffffffffffb8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffffa8,*(long *)(effective_feerate.nSatoshisPerK + 0x28),
             *(long *)(effective_feerate.nSatoshisPerK + 0x30) +
             *(long *)(effective_feerate.nSatoshisPerK + 0x28));
  state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)uVar2;
  state_00.super_ValidationState<TxValidationResult>.m_mode = (int)in_stack_ffffffffffffff78;
  state_00.super_ValidationState<TxValidationResult>.m_result =
       (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
       (size_type)puVar3;
  state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       in_stack_ffffffffffffff90;
  state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
       in_stack_ffffffffffffff98;
  state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)in_stack_ffffffffffffffa0;
  state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
       (size_type)puVar4;
  state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_allocated_capacity =
       in_stack_ffffffffffffffb0;
  state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
       in_stack_ffffffffffffffb8;
  MempoolAcceptResult(__return_storage_ptr__,state_00,(CFeeRate)&stack0xffffffffffffff80,
                      wtxids_fee_calculations);
  if (puVar4 != &stack0xffffffffffffffb8) {
    operator_delete(puVar4,in_stack_ffffffffffffffb8 + 1);
  }
  if (puVar3 != &stack0xffffffffffffff98) {
    operator_delete(puVar3,in_stack_ffffffffffffff98 + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static MempoolAcceptResult FeeFailure(TxValidationState state,
                                          CFeeRate effective_feerate,
                                          const std::vector<Wtxid>& wtxids_fee_calculations) {
        return MempoolAcceptResult(state, effective_feerate, wtxids_fee_calculations);
    }